

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_tree.hpp
# Opt level: O0

unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
tao::pegtl::parse_tree::
parse<queryparse::grammar,tao::pegtl::parse_tree::node,queryparse::store,tao::pegtl::normal,tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
          (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *in)

{
  bool bVar1;
  node *in_RDI;
  state<tao::pegtl::parse_tree::node> state;
  _Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false> in_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  in_00._M_head_impl = in_RDI;
  internal::state<tao::pegtl::parse_tree::node>::state
            ((state<tao::pegtl::parse_tree::node> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar1 = parse<queryparse::grammar,_tao::pegtl::nothing,_tao::pegtl::parse_tree::internal::make_control<queryparse::store,_tao::pegtl::normal>::type,_(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>_&>
                    ((string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_00._M_head_impl,(state<tao::pegtl::parse_tree::node> *)in_RDI);
  if (bVar1) {
    internal::state<tao::pegtl::parse_tree::node>::back
              ((state<tao::pegtl::parse_tree::node> *)0x1d5893);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_00._M_head_impl,
               (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_RDI);
  }
  else {
    std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>
    ::unique_ptr<std::default_delete<tao::pegtl::parse_tree::node>,void>
              ((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_00._M_head_impl,in_RDI);
  }
  internal::state<tao::pegtl::parse_tree::node>::~state
            ((state<tao::pegtl::parse_tree::node> *)0x1d58b1);
  return (__uniq_ptr_data<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>,_true,_true>
          )(tuple<tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
            )in_00._M_head_impl;
}

Assistant:

std::unique_ptr< Node > parse( Input& in, States&&... st )
         {
            internal::state< Node > state;
            if( !TAO_PEGTL_NAMESPACE::parse< Rule, nothing, internal::make_control< S, C >::template type >( in, state, st... ) ) {
               return nullptr;
            }
            assert( state.stack.size() == 1 );
            return std::move( state.back() );
         }